

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryArticulatedSystemsLoader.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryArticulatedSystemsLoader::LibraryArticulatedSystemsLoader
          (LibraryArticulatedSystemsLoader *this,IFilePartLoader *callingFilePartLoader)

{
  FilePartLoader::FilePartLoader(&this->super_FilePartLoader,callingFilePartLoader);
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__LibraryArticulatedSystemsLoader_009a7408;
  (this->mCurrentArticulatedId)._M_dataplus._M_p = (pointer)&(this->mCurrentArticulatedId).field_2;
  (this->mCurrentArticulatedId)._M_string_length = 0;
  (this->mCurrentArticulatedId).field_2._M_local_buf[0] = '\0';
  (this->mCurrentArticulatedName)._M_dataplus._M_p =
       (pointer)&(this->mCurrentArticulatedName).field_2;
  (this->mCurrentArticulatedName)._M_string_length = 0;
  (this->mCurrentArticulatedName).field_2._M_local_buf[0] = '\0';
  this->mCurrentKinematicsController = (KinematicsController *)0x0;
  this->mValueElementParentType = VALUE_ELEMENT_NONE;
  InstanceKinematicsModelLoader::InstanceKinematicsModelLoader
            (&this->mInstanceKinematicsModelLoader);
  this->mCurrentAxisInfo = (AxisInfo *)0x0;
  return;
}

Assistant:

LibraryArticulatedSystemsLoader::LibraryArticulatedSystemsLoader( IFilePartLoader* callingFilePartLoader )
		: FilePartLoader(callingFilePartLoader)
		, mCurrentKinematicsController(0)
		, mValueElementParentType(VALUE_ELEMENT_NONE)
		, mCurrentAxisInfo(0)
	{

	}